

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

int yaml_document_start_event_initialize
              (yaml_event_t *event,yaml_version_directive_t *version_directive,
              yaml_tag_directive_t *tag_directives_start,yaml_tag_directive_t *tag_directives_end,
              int implicit)

{
  yaml_char_t *__ptr;
  size_t size;
  bool bVar1;
  int iVar2;
  yaml_version_directive_t *__ptr_00;
  yaml_tag_directive_t *pyVar3;
  size_t sVar4;
  yaml_char_t *pyVar5;
  yaml_char_t *pyVar6;
  yaml_tag_directive_t *pyVar7;
  yaml_tag_directive_t *pyVar8;
  yaml_tag_directive_t *pyVar9;
  yaml_mark_t mark;
  
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x2d0,
                  "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                 );
  }
  if ((tag_directives_start != tag_directives_end) &&
     (tag_directives_start == (yaml_tag_directive_t *)0x0 ||
      tag_directives_end == (yaml_tag_directive_t *)0x0)) {
    __assert_fail("(tag_directives_start && tag_directives_end) || (tag_directives_start == tag_directives_end)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x2d2,
                  "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                 );
  }
  if (version_directive == (yaml_version_directive_t *)0x0) {
    __ptr_00 = (yaml_version_directive_t *)0x0;
LAB_00103715:
    if (tag_directives_start == tag_directives_end) {
      pyVar8 = (yaml_tag_directive_t *)0x0;
      pyVar3 = (yaml_tag_directive_t *)0x0;
    }
    else {
      pyVar3 = (yaml_tag_directive_t *)malloc(0x100);
      pyVar8 = pyVar3;
      if (pyVar3 == (yaml_tag_directive_t *)0x0) {
        pyVar3 = (yaml_tag_directive_t *)0x0;
LAB_0010386c:
        pyVar5 = (yaml_char_t *)0x0;
        pyVar6 = (yaml_char_t *)0x0;
LAB_00103872:
        bVar1 = false;
      }
      else {
        if (tag_directives_start != tag_directives_end) {
          pyVar9 = pyVar3 + 0x10;
          do {
            pyVar5 = tag_directives_start->handle;
            if (pyVar5 == (yaml_char_t *)0x0) {
              __assert_fail("tag_directive->handle",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                            ,0x2e2,
                            "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                           );
            }
            pyVar6 = tag_directives_start->prefix;
            if (pyVar6 == (yaml_char_t *)0x0) {
              __assert_fail("tag_directive->prefix",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                            ,0x2e3,
                            "int yaml_document_start_event_initialize(yaml_event_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int)"
                           );
            }
            sVar4 = strlen((char *)pyVar5);
            iVar2 = yaml_check_utf8(pyVar5,sVar4);
            if (iVar2 == 0) goto LAB_0010386c;
            sVar4 = strlen((char *)pyVar6);
            iVar2 = yaml_check_utf8(pyVar6,sVar4);
            if (iVar2 == 0) goto LAB_0010386c;
            pyVar5 = (yaml_char_t *)strdup((char *)pyVar5);
            pyVar6 = (yaml_char_t *)strdup((char *)pyVar6);
            if ((pyVar5 == (yaml_char_t *)0x0) || (pyVar6 == (yaml_char_t *)0x0)) goto LAB_00103872;
            if (pyVar3 == pyVar9) {
              bVar1 = true;
              if ((long)pyVar9 - (long)pyVar8 < 0x3fffffff) {
                size = ((long)pyVar9 - (long)pyVar8) * 2;
                pyVar7 = (yaml_tag_directive_t *)yaml_realloc(pyVar8,size);
                if (pyVar7 == (yaml_tag_directive_t *)0x0) {
                  bVar1 = true;
                }
                else {
                  pyVar3 = (yaml_tag_directive_t *)(((long)pyVar3 - (long)pyVar8) + (long)pyVar7);
                  pyVar9 = (yaml_tag_directive_t *)(size + (long)pyVar7);
                  bVar1 = false;
                  pyVar8 = pyVar7;
                }
              }
              if (bVar1) {
                bVar1 = false;
                goto LAB_00103881;
              }
            }
            pyVar3->handle = pyVar5;
            pyVar3->prefix = pyVar6;
            pyVar3 = pyVar3 + 1;
            tag_directives_start = tag_directives_start + 1;
          } while (tag_directives_start != tag_directives_end);
        }
        pyVar5 = (yaml_char_t *)0x0;
        pyVar6 = (yaml_char_t *)0x0;
        bVar1 = true;
      }
LAB_00103881:
      if (!bVar1) goto LAB_001038fa;
    }
    *(undefined8 *)event = 0;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    (event->end_mark).index = 0;
    (event->end_mark).line = 0;
    (event->start_mark).line = 0;
    (event->start_mark).column = 0;
    *(undefined8 *)((long)&event->data + 0x28) = 0;
    (event->start_mark).index = 0;
    (event->data).scalar.length = 0;
    *(undefined8 *)((long)&event->data + 0x20) = 0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
    (event->end_mark).column = 0;
    event->type = YAML_DOCUMENT_START_EVENT;
    (event->start_mark).index = 0;
    (event->start_mark).line = 0;
    (event->start_mark).column = 0;
    (event->end_mark).index = 0;
    (event->end_mark).line = 0;
    (event->end_mark).column = 0;
    (event->data).document_start.version_directive = __ptr_00;
    (event->data).document_start.tag_directives.start = pyVar8;
    (event->data).document_start.tag_directives.end = pyVar3;
    (event->data).document_start.implicit = implicit;
    iVar2 = 1;
  }
  else {
    __ptr_00 = (yaml_version_directive_t *)malloc(8);
    if (__ptr_00 != (yaml_version_directive_t *)0x0) {
      __ptr_00->major = version_directive->major;
      __ptr_00->minor = version_directive->minor;
      goto LAB_00103715;
    }
    pyVar8 = (yaml_tag_directive_t *)0x0;
    pyVar3 = (yaml_tag_directive_t *)0x0;
    __ptr_00 = (yaml_version_directive_t *)0x0;
    pyVar5 = (yaml_char_t *)0x0;
    pyVar6 = (yaml_char_t *)0x0;
LAB_001038fa:
    if (__ptr_00 != (yaml_version_directive_t *)0x0) {
      free(__ptr_00);
    }
    for (; pyVar8 != pyVar3; pyVar3 = pyVar3 + -1) {
      __ptr = pyVar3[-1].prefix;
      if (pyVar3[-1].handle != (yaml_char_t *)0x0) {
        free(pyVar3[-1].handle);
      }
      if (__ptr != (yaml_char_t *)0x0) {
        free(__ptr);
      }
    }
    if (pyVar8 != (yaml_tag_directive_t *)0x0) {
      free(pyVar8);
    }
    if (pyVar5 != (yaml_char_t *)0x0) {
      free(pyVar5);
    }
    iVar2 = 0;
    if (pyVar6 != (yaml_char_t *)0x0) {
      free(pyVar6);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

YAML_DECLARE(int)
yaml_document_start_event_initialize(yaml_event_t *event,
        yaml_version_directive_t *version_directive,
        yaml_tag_directive_t *tag_directives_start,
        yaml_tag_directive_t *tag_directives_end,
        int implicit)
{
    struct {
        yaml_error_type_t error;
    } context;
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_version_directive_t *version_directive_copy = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
        yaml_tag_directive_t *top;
    } tag_directives_copy = { NULL, NULL, NULL };
    yaml_tag_directive_t value = { NULL, NULL };

    assert(event);          /* Non-NULL event object is expected. */
    assert((tag_directives_start && tag_directives_end) ||
            (tag_directives_start == tag_directives_end));
                            /* Valid tag directives are expected. */

    if (version_directive) {
        version_directive_copy = YAML_MALLOC_STATIC(yaml_version_directive_t);
        if (!version_directive_copy) goto error;
        version_directive_copy->major = version_directive->major;
        version_directive_copy->minor = version_directive->minor;
    }

    if (tag_directives_start != tag_directives_end) {
        yaml_tag_directive_t *tag_directive;
        if (!STACK_INIT(&context, tag_directives_copy, yaml_tag_directive_t*))
            goto error;
        for (tag_directive = tag_directives_start;
                tag_directive != tag_directives_end; tag_directive ++) {
            assert(tag_directive->handle);
            assert(tag_directive->prefix);
            if (!yaml_check_utf8(tag_directive->handle,
                        strlen((char *)tag_directive->handle)))
                goto error;
            if (!yaml_check_utf8(tag_directive->prefix,
                        strlen((char *)tag_directive->prefix)))
                goto error;
            value.handle = yaml_strdup(tag_directive->handle);
            value.prefix = yaml_strdup(tag_directive->prefix);
            if (!value.handle || !value.prefix) goto error;
            if (!PUSH(&context, tag_directives_copy, value))
                goto error;
            value.handle = NULL;
            value.prefix = NULL;
        }
    }

    DOCUMENT_START_EVENT_INIT(*event, version_directive_copy,
            tag_directives_copy.start, tag_directives_copy.top,
            implicit, mark, mark);

    return 1;

error:
    yaml_free(version_directive_copy);
    while (!STACK_EMPTY(context, tag_directives_copy)) {
        yaml_tag_directive_t value = POP(context, tag_directives_copy);
        yaml_free(value.handle);
        yaml_free(value.prefix);
    }
    STACK_DEL(context, tag_directives_copy);
    yaml_free(value.handle);
    yaml_free(value.prefix);

    return 0;
}